

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::UInt64Size(RepeatedField<unsigned_long> *value)

{
  long lVar1;
  int iVar2;
  const_reference puVar3;
  size_t sVar4;
  int index;
  
  iVar2 = RepeatedField<unsigned_long>::size(value);
  sVar4 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (index = 0; iVar2 != index; index = index + 1) {
    puVar3 = RepeatedField<unsigned_long>::Get(value,index);
    lVar1 = 0x3f;
    if ((*puVar3 | 1) != 0) {
      for (; (*puVar3 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar1 * 9 + 0x49U >> 6);
  }
  return sVar4;
}

Assistant:

size_t WireFormatLite::UInt64Size(const RepeatedField<uint64_t>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += UInt64Size(value.Get(i));
  }
  return out;
}